

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

indirect_string * __thiscall
pstore::serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>
          (indirect_string *__return_storage_ptr__,serialize *this,database_reader *archive)

{
  indirect_string *uninit;
  unique_ptr<pstore::indirect_string,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_40;
  unique_ptr<pstore::indirect_string,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  anon_class_1_0_00000001_for__M_head_impl dtor;
  T2 *t2;
  type uninit_buffer;
  database_reader *archive_local;
  
  uninit_buffer._._16_8_ = this;
  flood<pstore::serialize::details::aligned_storage<24ul,8ul>::type>((type *)&t2);
  read_uninit<pstore::serialize::archive::database_reader,pstore::indirect_string>
            ((serialize *)uninit_buffer._._16_8_,(database_reader *)&t2,uninit);
  std::
  unique_ptr<pstore::indirect_string,pstore::serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::{lambda(pstore::indirect_string*)#1}>
  ::
  unique_ptr<pstore::serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::_lambda(pstore::indirect_string*)_1_,void>
            ((unique_ptr<pstore::indirect_string,pstore::serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::_lambda(pstore::indirect_string*)_1_>
              *)&local_40,(pointer)&t2,
             (deleter_type *)
             ((long)&d._M_t.
                     super___uniq_ptr_impl<pstore::indirect_string,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     ._M_t.
                     super__Tuple_impl<0UL,_pstore::indirect_string_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     .super__Head_base<0UL,_pstore::indirect_string_*,_false>._M_head_impl + 7));
  __return_storage_ptr__->db_ = (database *)t2;
  __return_storage_ptr__->is_pointer_ = (bool)uninit_buffer._[0];
  __return_storage_ptr__->field_0x9 = uninit_buffer._[1];
  __return_storage_ptr__->field_0xa = uninit_buffer._[2];
  __return_storage_ptr__->field_0xb = uninit_buffer._[3];
  __return_storage_ptr__->field_0xc = uninit_buffer._[4];
  __return_storage_ptr__->field_0xd = uninit_buffer._[5];
  __return_storage_ptr__->field_0xe = uninit_buffer._[6];
  __return_storage_ptr__->field_0xf = uninit_buffer._[7];
  __return_storage_ptr__->field_2 =
       (anon_union_8_2_d34ab9e4_for_indirect_string_3)uninit_buffer._._8_8_;
  std::
  unique_ptr<pstore::indirect_string,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }